

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O3

int __thiscall DmgFactors::Apply(DmgFactors *this,FName *type,int damage)

{
  uint uVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  
  uVar1 = type->Index;
  pNVar2 = (this->super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>).Nodes;
  pNVar3 = pNVar2 + ((this->super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>).
                     Size - 1 & uVar1);
  while ((pNVar4 = pNVar3, pNVar4 != (Node *)0x0 && (pNVar4->Next != (Node *)0x1))) {
    pNVar3 = pNVar4->Next;
    if ((pNVar4->Pair).Key.Index == uVar1) goto LAB_0039e199;
  }
  if (uVar1 == 0) {
    return damage;
  }
  do {
    pNVar4 = pNVar2;
    if (pNVar4 == (Node *)0x0) {
      return damage;
    }
    if (pNVar4->Next == (Node *)0x1) {
      return damage;
    }
    pNVar2 = pNVar4->Next;
  } while ((pNVar4->Pair).Key.Index != 0);
LAB_0039e199:
  return (int)((double)damage * (pNVar4->Pair).Value);
}

Assistant:

int DmgFactors::Apply(FName type, int damage)
{
	auto pdf = CheckKey(type);
	if (pdf == NULL && type != NAME_None)
	{
		pdf = CheckKey(NAME_None);
	}
	if (!pdf) return damage;
	return int(damage * *pdf);
}